

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O2

bool __thiscall
Js::StepController::IsStepComplete_AllowingFalsePositives
          (StepController *this,InterpreterStackFrame *stackFrame)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  DWORD_PTR DVar6;
  FunctionBody *body;
  char *this_00;
  
  this_00 = (char *)this;
  if (stackFrame == (InterpreterStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
    ;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
                                ,0xdf,"(stackFrame)","stackFrame");
    if (!bVar3) goto LAB_007f98b3;
    *puVar5 = 0;
  }
  if (this->stepType == STEP_IN) {
    bVar3 = true;
  }
  else if (this->stepType == STEP_DOCUMENT) {
    body = *(FunctionBody **)(stackFrame + 0x88);
    if (body == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      this_00 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
      ;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
                                  ,0xe6,"(stackFrame->GetFunctionBody())",
                                  "stackFrame->GetFunctionBody()");
      if (!bVar3) {
LAB_007f98b3:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      body = *(FunctionBody **)(stackFrame + 0x88);
    }
    uVar4 = GetScriptId((StepController *)this_00,body);
    bVar3 = uVar4 != this->scriptIdWhenSet;
  }
  else {
    uVar1 = this->frameAddrWhenSet;
    DVar6 = InterpreterStackFrame::GetStackAddress(stackFrame);
    bVar3 = uVar1 <= DVar6;
  }
  return bVar3;
}

Assistant:

bool StepController::IsStepComplete_AllowingFalsePositives(InterpreterStackFrame * stackFrame)
    {
        Assert(stackFrame);
        if (stepType == STEP_IN)
        {
            return true;
        }
        else if (stepType == STEP_DOCUMENT)
        {
            Assert(stackFrame->GetFunctionBody());
            return GetScriptId(stackFrame->GetFunctionBody()) != this->scriptIdWhenSet;
        }

        // A STEP_OUT or a STEP_OVER has not completed if we are currently deeper on the callstack.
        return this->frameAddrWhenSet <= stackFrame->GetStackAddress();
    }